

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::GenerateRegressionImages(cmCTestTestHandler *this,cmXMLWriter *xml,string *dart)

{
  char *pcVar1;
  pointer pcVar2;
  char *pcVar3;
  cmCTest *this_00;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  cmCTestTestHandler *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  unsigned_long length;
  uchar *puVar10;
  size_t sVar11;
  ostream *poVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  ulong uVar16;
  bool bVar17;
  string k2;
  string v2;
  ostringstream ostr;
  string cxml;
  ifstream ifs;
  RegularExpression measurementfile;
  RegularExpression fourattributes;
  RegularExpression twoattributes;
  RegularExpression threeattributes;
  RegularExpression cdatastart;
  RegularExpression cdataend;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  string local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  undefined1 local_928 [8];
  char *local_920;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_918 [6];
  ios_base local_8b8 [264];
  long *local_7b0 [2];
  long local_7a0 [2];
  undefined1 local_790 [112];
  ios_base local_720 [408];
  string local_588;
  uchar *local_568;
  uchar *local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  cmCTestTestHandler *local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_370.regmatch.startp[0] = (char *)0x0;
  local_370.regmatch.endp[0] = (char *)0x0;
  local_370.regmatch.searchstring = (char *)0x0;
  local_370.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_370,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_2a0.regmatch.startp[0] = (char *)0x0;
  local_2a0.regmatch.endp[0] = (char *)0x0;
  local_2a0.regmatch.searchstring = (char *)0x0;
  local_2a0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_2a0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_440.regmatch.startp[0] = (char *)0x0;
  local_440.regmatch.endp[0] = (char *)0x0;
  local_440.regmatch.searchstring = (char *)0x0;
  local_440.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_440,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_1d0.regmatch.startp[0] = (char *)0x0;
  local_1d0.regmatch.endp[0] = (char *)0x0;
  local_1d0.regmatch.searchstring = (char *)0x0;
  local_1d0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_1d0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>[ \t\r\n]*<!\\[CDATA\\["
            );
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"]]>[ \t\r\n]*</DartMeasurement>");
  local_510.regmatch.startp[0] = (char *)0x0;
  local_510.regmatch.endp[0] = (char *)0x0;
  local_510.regmatch.searchstring = (char *)0x0;
  local_510.program = (char *)0x0;
  local_538 = this;
  cmsys::RegularExpression::compile
            (&local_510,
             "<DartMeasurementFile[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurementFile>"
            );
  local_7b0[0] = local_7a0;
  pcVar2 = (dart->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_7b0,pcVar2,pcVar2 + dart->_M_string_length);
  pcVar1 = local_790 + 0x10;
  bVar17 = false;
  do {
    bVar7 = cmsys::RegularExpression::find(&local_370,(char *)local_7b0[0],&local_370.regmatch);
    if (bVar7) {
      local_790._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_790);
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      if (local_370.regmatch.startp[1] == (char *)0x0) {
        local_790._8_8_ = 0;
        local_790[0x10] = '\0';
        local_790._0_8_ = pcVar1;
      }
      else {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_790,local_370.regmatch.startp[1],local_370.regmatch.endp[1]);
      }
      uVar5 = local_790._0_8_;
      if (local_370.regmatch.startp[2] == (char *)0x0) {
        local_928 = (undefined1  [8])local_918;
        local_920 = (char *)0x0;
        local_918[0]._M_allocated_capacity = local_918[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
      }
      else {
        local_928 = (undefined1  [8])local_918;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_928,local_370.regmatch.startp[2],local_370.regmatch.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,(char *)uVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
      if (local_928 != (undefined1  [8])local_918) {
        operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      if (local_370.regmatch.startp[3] == (char *)0x0) {
        local_790._8_8_ = 0;
        local_790[0x10] = '\0';
        local_790._0_8_ = pcVar1;
      }
      else {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_790,local_370.regmatch.startp[3],local_370.regmatch.endp[3]);
      }
      uVar5 = local_790._0_8_;
      if (local_370.regmatch.startp[4] == (char *)0x0) {
        local_928 = (undefined1  [8])local_918;
        local_920 = (char *)0x0;
        local_918[0]._M_allocated_capacity = local_918[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
      }
      else {
        local_928 = (undefined1  [8])local_918;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_928,local_370.regmatch.startp[4],local_370.regmatch.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,(char *)uVar5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
      if (local_928 != (undefined1  [8])local_918) {
        operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      local_790._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
      if (local_370.regmatch.startp[5] == (char *)0x0) {
        local_928 = (undefined1  [8])local_918;
        local_920 = (char *)0x0;
        local_918[0]._M_allocated_capacity = local_918[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
      }
      else {
        local_928 = (undefined1  [8])local_918;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_928,local_370.regmatch.startp[5],local_370.regmatch.endp[5]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_790);
      cmXMLWriter::Content<std::__cxx11::string>
                (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928)
      ;
      cmXMLWriter::EndElement(xml);
      if (local_928 != (undefined1  [8])local_918) {
        operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar16 = (long)local_370.regmatch.startp[0] - (long)local_370.regmatch.searchstring;
LAB_001b33ee:
      std::__cxx11::string::erase((ulong)local_7b0,uVar16);
      bVar7 = bVar17;
    }
    else {
      bVar7 = cmsys::RegularExpression::find(&local_2a0,(char *)local_7b0[0],&local_2a0.regmatch);
      if (bVar7) {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_2a0.regmatch.startp[1] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_2a0.regmatch.startp[1],local_2a0.regmatch.endp[1]);
        }
        uVar5 = local_790._0_8_;
        if (local_2a0.regmatch.startp[2] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_2a0.regmatch.startp[2],local_2a0.regmatch.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_2a0.regmatch.startp[3] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_2a0.regmatch.startp[3],local_2a0.regmatch.endp[3]);
        }
        uVar5 = local_790._0_8_;
        if (local_2a0.regmatch.startp[4] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_2a0.regmatch.startp[4],local_2a0.regmatch.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_2a0.regmatch.startp[5] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_2a0.regmatch.startp[5],local_2a0.regmatch.endp[5]);
        }
        uVar5 = local_790._0_8_;
        if (local_2a0.regmatch.startp[6] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_2a0.regmatch.startp[6],local_2a0.regmatch.endp[6]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
        if (local_370.regmatch.startp[7] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_370.regmatch.startp[7],local_370.regmatch.endp[7]);
        }
        cmXMLWriter::StartElement(xml,(string *)local_790);
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_928);
        cmXMLWriter::EndElement(xml);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        uVar16 = (long)local_2a0.regmatch.startp[0] - (long)local_2a0.regmatch.searchstring;
        goto LAB_001b33ee;
      }
      bVar7 = cmsys::RegularExpression::find(&local_440,(char *)local_7b0[0],&local_440.regmatch);
      if (bVar7) {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.regmatch.startp[1] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.regmatch.startp[1],local_440.regmatch.endp[1]);
        }
        uVar5 = local_790._0_8_;
        if (local_440.regmatch.startp[2] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_440.regmatch.startp[2],local_440.regmatch.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.regmatch.startp[3] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.regmatch.startp[3],local_440.regmatch.endp[3]);
        }
        uVar5 = local_790._0_8_;
        if (local_440.regmatch.startp[4] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_440.regmatch.startp[4],local_440.regmatch.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.regmatch.startp[5] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.regmatch.startp[5],local_440.regmatch.endp[5]);
        }
        uVar5 = local_790._0_8_;
        if (local_440.regmatch.startp[6] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_440.regmatch.startp[6],local_440.regmatch.endp[6]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.regmatch.startp[7] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.regmatch.startp[7],local_440.regmatch.endp[7]);
        }
        uVar5 = local_790._0_8_;
        if (local_440.regmatch.startp[8] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_440.regmatch.startp[8],local_440.regmatch.endp[8]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
        if (local_370.regmatch.startp[9] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_370.regmatch.startp[9],local_370.regmatch.endp[9]);
        }
        cmXMLWriter::StartElement(xml,(string *)local_790);
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_928);
        cmXMLWriter::EndElement(xml);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        uVar16 = (long)local_440.regmatch.startp[0] - (long)local_440.regmatch.searchstring;
        goto LAB_001b33ee;
      }
      bVar7 = cmsys::RegularExpression::find(&local_1d0,(char *)local_7b0[0],&local_1d0.regmatch);
      if ((bVar7) &&
         (bVar7 = cmsys::RegularExpression::find
                            (&local_100,(char *)local_7b0[0],&local_100.regmatch), bVar7)) {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_1d0.regmatch.startp[1] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_1d0.regmatch.startp[1],local_1d0.regmatch.endp[1]);
        }
        uVar5 = local_790._0_8_;
        if (local_1d0.regmatch.startp[2] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_1d0.regmatch.startp[2],local_1d0.regmatch.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_1d0.regmatch.startp[3] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_1d0.regmatch.startp[3],local_1d0.regmatch.endp[3]);
        }
        uVar5 = local_790._0_8_;
        if (local_1d0.regmatch.startp[4] == (char *)0x0) {
          local_928 = (undefined1  [8])local_918;
          local_920 = (char *)0x0;
          local_918[0]._M_allocated_capacity =
               local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_928 = (undefined1  [8])local_918;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_928,local_1d0.regmatch.startp[4],local_1d0.regmatch.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
        if (local_928 != (undefined1  [8])local_918) {
          operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        std::__cxx11::string::substr((ulong)local_790,(ulong)local_7b0);
        cmXMLWriter::CData(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        cmXMLWriter::EndElement(xml);
        uVar16 = (long)local_1d0.regmatch.startp[0] - (long)local_1d0.regmatch.searchstring;
        goto LAB_001b33ee;
      }
      bVar8 = cmsys::RegularExpression::find(&local_510,(char *)local_7b0[0],&local_510.regmatch);
      bVar7 = true;
      if (bVar8) {
        if (local_510.regmatch.startp[5] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_510.regmatch.startp[5],local_510.regmatch.endp[5]);
        }
        cmCTest::CleanString(&local_588,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        bVar7 = cmsys::SystemTools::FileExists(&local_588);
        if (bVar7) {
          length = cmsys::SystemTools::FileLength(&local_588);
          if (length == 0) {
            if (local_510.regmatch.startp[1] == (char *)0x0) {
              local_790._8_8_ = 0;
              local_790[0x10] = '\0';
              local_790._0_8_ = pcVar1;
            }
            else {
              local_790._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_790,local_510.regmatch.startp[1],local_510.regmatch.endp[1]
                        );
            }
            if (local_510.regmatch.startp[2] == (char *)0x0) {
              local_928 = (undefined1  [8])local_918;
              local_920 = (char *)0x0;
              local_918[0]._M_allocated_capacity =
                   local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_928 = (undefined1  [8])local_918;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_928,local_510.regmatch.startp[2],local_510.regmatch.endp[2]
                        );
            }
            if (local_510.regmatch.startp[3] == (char *)0x0) {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              local_988._M_string_length = 0;
              local_988.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,local_510.regmatch.startp[3],
                         local_510.regmatch.endp[3]);
            }
            if (local_510.regmatch.startp[4] == (char *)0x0) {
              local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
              local_948._M_string_length = 0;
              local_948.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_948,local_510.regmatch.startp[4],
                         local_510.regmatch.endp[4]);
            }
            cmsys::SystemTools::LowerCase(&local_968,(string *)local_790);
            iVar9 = std::__cxx11::string::compare((char *)&local_968);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_968._M_dataplus._M_p != &local_968.field_2) {
              operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1
                             );
            }
            if (iVar9 == 0) {
              std::__cxx11::string::_M_replace((ulong)local_928,0,local_920,0x53b333);
            }
            cmsys::SystemTools::LowerCase(&local_968,&local_988);
            iVar9 = std::__cxx11::string::compare((char *)&local_968);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_968._M_dataplus._M_p != &local_968.field_2) {
              operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1
                             );
            }
            if (iVar9 == 0) {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_948,0,(char *)local_948._M_string_length,0x53b333);
            }
            local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_968,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,&local_968);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_968._M_dataplus._M_p != &local_968.field_2) {
              operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1
                             );
            }
            cmXMLWriter::Attribute<std::__cxx11::string>
                      (xml,(char *)local_790._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_928);
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,local_988._M_dataplus._M_p,&local_948);
            cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x53d0fa);
            local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"Value","");
            std::operator+(&local_530,"Image ",&local_588);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_530);
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
            psVar15 = (size_type *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_558.field_2._M_allocated_capacity = *psVar15;
              local_558.field_2._8_8_ = plVar13[3];
            }
            else {
              local_558.field_2._M_allocated_capacity = *psVar15;
              local_558._M_dataplus._M_p = (pointer)*plVar13;
            }
            local_558._M_string_length = plVar13[1];
            *plVar13 = (long)psVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            cmXMLWriter::StartElement(xml,&local_968);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&local_558);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_968._M_dataplus._M_p != &local_968.field_2) {
              operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1
                             );
            }
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,
                              CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                       local_948.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            if (local_928 != (undefined1  [8])local_918) {
              operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
            }
            if ((char *)local_790._0_8_ != pcVar1) {
              operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1
                             );
            }
          }
          else {
            std::ifstream::ifstream(local_790,local_588._M_dataplus._M_p,_S_in);
            puVar10 = (uchar *)operator_new__(length + 1);
            std::istream::read(local_790,(long)puVar10);
            local_568 = puVar10;
            local_560 = (uchar *)operator_new__((long)(int)((double)(long)length * 1.5 + 5.0));
            sVar11 = cmsysBase64_Encode(local_568,length,local_560,1);
            local_928 = (undefined1  [8])local_918;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_928,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,(string *)local_928);
            if (local_928 != (undefined1  [8])local_918) {
              operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
            }
            if (local_510.regmatch.startp[1] == (char *)0x0) {
              local_928 = (undefined1  [8])local_918;
              local_920 = (char *)0x0;
              local_918[0]._M_allocated_capacity =
                   local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_928 = (undefined1  [8])local_918;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_928,local_510.regmatch.startp[1],local_510.regmatch.endp[1]
                        );
            }
            auVar4 = local_928;
            if (local_510.regmatch.startp[2] == (char *)0x0) {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              local_988._M_string_length = 0;
              local_988.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,local_510.regmatch.startp[2],
                         local_510.regmatch.endp[2]);
            }
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)auVar4,&local_988);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            if (local_928 != (undefined1  [8])local_918) {
              operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
            }
            if (local_510.regmatch.startp[3] == (char *)0x0) {
              local_928 = (undefined1  [8])local_918;
              local_920 = (char *)0x0;
              local_918[0]._M_allocated_capacity =
                   local_918[0]._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_928 = (undefined1  [8])local_918;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_928,local_510.regmatch.startp[3],local_510.regmatch.endp[3]
                        );
            }
            auVar4 = local_928;
            if (local_510.regmatch.startp[4] == (char *)0x0) {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              local_988._M_string_length = 0;
              local_988.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,local_510.regmatch.startp[4],
                         local_510.regmatch.endp[4]);
            }
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)auVar4,&local_988);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            if (local_928 != (undefined1  [8])local_918) {
              operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
            }
            cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_928);
            if (sVar11 != 0) {
              uVar16 = 0;
              do {
                local_988._M_dataplus._M_p._0_1_ = local_560[uVar16];
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_928,(char *)&local_988,1);
                if ((uVar16 != 0) && ((uVar16 / 0x3c) * 0x3c - uVar16 == 0)) {
                  std::ios::widen((char)*(undefined8 *)((long)local_928 + -0x18) + (char)local_928);
                  std::ostream::put((char)local_928);
                  std::ostream::flush();
                }
                uVar16 = uVar16 + 1;
              } while (sVar11 != uVar16);
            }
            local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"Value","");
            std::__cxx11::stringbuf::str();
            puVar10 = local_568;
            cmXMLWriter::StartElement(xml,&local_988);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&local_948);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,
                              CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                       local_948.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            cmXMLWriter::EndElement(xml);
            operator_delete__(puVar10);
            operator_delete__(local_560);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_928);
            std::ios_base::~ios_base(local_8b8);
            std::ifstream::~ifstream(local_790);
          }
        }
        else {
          if (local_510.regmatch.startp[1] == (char *)0x0) {
            local_790._8_8_ = 0;
            local_790[0x10] = '\0';
            local_790._0_8_ = pcVar1;
          }
          else {
            local_790._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_790,local_510.regmatch.startp[1],local_510.regmatch.endp[1]);
          }
          iVar9 = std::__cxx11::string::compare(local_790);
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","")
          ;
          cmXMLWriter::StartElement(xml,(string *)local_790);
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          pcVar3 = local_510.regmatch.startp[(ulong)(iVar9 != 0) * 2 + 2];
          if (pcVar3 == (char *)0x0) {
            local_790._8_8_ = 0;
            local_790[0x10] = '\0';
            local_790._0_8_ = pcVar1;
          }
          else {
            local_790._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_790,pcVar3,
                       local_510.regmatch.endp[(ulong)(iVar9 != 0) * 2 + 2]);
          }
          cmXMLWriter::Attribute<std::__cxx11::string>
                    (xml,"name",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790)
          ;
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
          std::operator+(&local_988,"File ",&local_588);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_988);
          local_928 = (undefined1  [8])local_918;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 == paVar14) {
            local_918[0]._0_8_ = paVar14->_M_allocated_capacity;
            local_918[0]._8_8_ = plVar13[3];
          }
          else {
            local_918[0]._0_8_ = paVar14->_M_allocated_capacity;
            local_928 = (undefined1  [8])*plVar13;
          }
          local_920 = (char *)plVar13[1];
          *plVar13 = (long)paVar14;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          cmXMLWriter::StartElement(xml,(string *)local_790);
          cmXMLWriter::Content<std::__cxx11::string>
                    (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_928);
          cmXMLWriter::EndElement(xml);
          if (local_928 != (undefined1  [8])local_918) {
            operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_988._M_dataplus._M_p != &local_988.field_2) {
            operator_delete(local_988._M_dataplus._M_p,
                            CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                     local_988.field_2._M_local_buf[0]) + 1);
          }
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          cmXMLWriter::EndElement(xml);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_790);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_790,"File \"",6);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_790,local_588._M_dataplus._M_p,
                               local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" not found.",0xc);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pcVar6 = local_538;
          this_00 = (local_538->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(this_00,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x7fe,(char *)local_928,(pcVar6->super_cmCTestGenericHandler).Quiet);
          if (local_928 != (undefined1  [8])local_918) {
            operator_delete((void *)local_928,local_918[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_790);
          std::ios_base::~ios_base(local_720);
        }
        std::__cxx11::string::erase
                  ((ulong)local_7b0,
                   (long)local_510.regmatch.startp[0] - (long)local_510.regmatch.searchstring);
        bVar7 = bVar17;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
      }
    }
    bVar17 = bVar7;
    if (bVar7) {
      if (local_7b0[0] != local_7a0) {
        operator_delete(local_7b0[0],local_7a0[0] + 1);
      }
      if (local_510.program != (char *)0x0) {
        operator_delete__(local_510.program);
      }
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      if (local_1d0.program != (char *)0x0) {
        operator_delete__(local_1d0.program);
      }
      if (local_440.program != (char *)0x0) {
        operator_delete__(local_440.program);
      }
      if (local_2a0.program != (char *)0x0) {
        operator_delete__(local_2a0.program);
      }
      if (local_370.program != (char *)0x0) {
        operator_delete__(local_370.program);
      }
      return;
    }
  } while( true );
}

Assistant:

void cmCTestTestHandler::GenerateRegressionImages(cmXMLWriter& xml,
                                                  const std::string& dart)
{
  cmsys::RegularExpression twoattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression threeattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression fourattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression cdatastart(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>" SPACE_REGEX "*<!\\[CDATA\\[");
  cmsys::RegularExpression cdataend("]]>" SPACE_REGEX "*</DartMeasurement>");
  cmsys::RegularExpression measurementfile(
    "<DartMeasurementFile" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurementFile>");

  bool done = false;
  std::string cxml = dart;
  while (!done) {
    if (twoattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(twoattributes.match(1).c_str(), twoattributes.match(2));
      xml.Attribute(twoattributes.match(3).c_str(), twoattributes.match(4));
      xml.Element("Value", twoattributes.match(5));
      xml.EndElement();
      cxml.erase(twoattributes.start(),
                 twoattributes.end() - twoattributes.start());
    } else if (threeattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(threeattributes.match(1).c_str(),
                    threeattributes.match(2));
      xml.Attribute(threeattributes.match(3).c_str(),
                    threeattributes.match(4));
      xml.Attribute(threeattributes.match(5).c_str(),
                    threeattributes.match(6));
      xml.Element("Value", twoattributes.match(7));
      xml.EndElement();
      cxml.erase(threeattributes.start(),
                 threeattributes.end() - threeattributes.start());
    } else if (fourattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(fourattributes.match(1).c_str(), fourattributes.match(2));
      xml.Attribute(fourattributes.match(3).c_str(), fourattributes.match(4));
      xml.Attribute(fourattributes.match(5).c_str(), fourattributes.match(6));
      xml.Attribute(fourattributes.match(7).c_str(), fourattributes.match(8));
      xml.Element("Value", twoattributes.match(9));
      xml.EndElement();
      cxml.erase(fourattributes.start(),
                 fourattributes.end() - fourattributes.start());
    } else if (cdatastart.find(cxml) && cdataend.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(cdatastart.match(1).c_str(), cdatastart.match(2));
      xml.Attribute(cdatastart.match(3).c_str(), cdatastart.match(4));
      xml.StartElement("Value");
      xml.CData(
        cxml.substr(cdatastart.end(), cdataend.start() - cdatastart.end()));
      xml.EndElement(); // Value
      xml.EndElement(); // NamedMeasurement
      cxml.erase(cdatastart.start(), cdataend.end() - cdatastart.start());
    } else if (measurementfile.find(cxml)) {
      const std::string& filename =
        cmCTest::CleanString(measurementfile.match(5));
      if (cmSystemTools::FileExists(filename)) {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          std::string k1 = measurementfile.match(1);
          std::string v1 = measurementfile.match(2);
          std::string k2 = measurementfile.match(3);
          std::string v2 = measurementfile.match(4);
          if (cmSystemTools::LowerCase(k1) == "type") {
            v1 = "text/string";
          }
          if (cmSystemTools::LowerCase(k2) == "type") {
            v2 = "text/string";
          }

          xml.StartElement("NamedMeasurement");
          xml.Attribute(k1.c_str(), v1);
          xml.Attribute(k2.c_str(), v2);
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          cmsys::ifstream ifs(filename.c_str(),
                              std::ios::in
#ifdef _WIN32
                                | std::ios::binary
#endif
          );
          unsigned char* file_buffer = new unsigned char[len + 1];
          ifs.read(reinterpret_cast<char*>(file_buffer), len);
          unsigned char* encoded_buffer = new unsigned char[static_cast<int>(
            static_cast<double>(len) * 1.5 + 5.0)];

          size_t rlen =
            cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

          xml.StartElement("NamedMeasurement");
          xml.Attribute(measurementfile.match(1).c_str(),
                        measurementfile.match(2));
          xml.Attribute(measurementfile.match(3).c_str(),
                        measurementfile.match(4));
          xml.Attribute("encoding", "base64");
          std::ostringstream ostr;
          for (size_t cc = 0; cc < rlen; cc++) {
            ostr << encoded_buffer[cc];
            if (cc % 60 == 0 && cc) {
              ostr << std::endl;
            }
          }
          xml.Element("Value", ostr.str());
          xml.EndElement(); // NamedMeasurement
          delete[] file_buffer;
          delete[] encoded_buffer;
        }
      } else {
        int idx = 4;
        if (measurementfile.match(1) == "name") {
          idx = 2;
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", measurementfile.match(idx));
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      }
      cxml.erase(measurementfile.start(),
                 measurementfile.end() - measurementfile.start());
    } else {
      done = true;
    }
  }
}